

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pmlinuxalsa.c
# Opt level: O0

PmError alsa_write_short(PmInternal *midi,PmEvent *event)

{
  void *pvVar1;
  int iVar2;
  uchar byte;
  alsa_descriptor_type desc;
  int local_28;
  int i;
  PmMessage msg;
  int bytes;
  PmEvent *event_local;
  PmInternal *midi_local;
  
  iVar2 = midi_message_length(event->message);
  local_28 = event->message;
  pvVar1 = midi->descriptor;
  if (pvVar1 == (void *)0x0) {
    midi_local._4_4_ = pmBadPtr;
  }
  else {
    desc._4_4_ = 0;
    while ((desc._4_4_ < iVar2 &&
           (alsa_write_byte(midi,(uchar)local_28,event->timestamp),
           -1 < *(int *)((long)pvVar1 + 0x18)))) {
      local_28 = local_28 >> 8;
      desc._4_4_ = desc._4_4_ + 1;
    }
    if (*(int *)((long)pvVar1 + 0x18) < 0) {
      midi_local._4_4_ = pmHostError;
    }
    else {
      *(undefined4 *)((long)pvVar1 + 0x18) = 0;
      midi_local._4_4_ = pmNoData;
    }
  }
  return midi_local._4_4_;
}

Assistant:

static PmError alsa_write_short(PmInternal *midi, PmEvent *event)
{
    int bytes = midi_message_length(event->message);
    PmMessage msg = event->message;
    int i;
    alsa_descriptor_type desc = (alsa_descriptor_type) midi->descriptor;
    if (!desc) return pmBadPtr;
    for (i = 0; i < bytes; i++) {
        unsigned char byte = msg;
        VERBOSE printf("sending 0x%x\n", byte);
        alsa_write_byte(midi, byte, event->timestamp);
        if (desc->error < 0) break;
        msg >>= 8; /* shift next byte into position */
    }
    if (desc->error < 0) return pmHostError;
    desc->error = pmNoError;
    return pmNoError;
}